

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

time_t Curl_pp_state_timeout(pingpong *pp)

{
  connectdata *pcVar1;
  Curl_easy *pCVar2;
  time_t tVar3;
  timeval tVar4;
  long local_78;
  long local_60;
  long response_time;
  time_t timeout2_ms;
  time_t timeout_ms;
  Curl_easy *data;
  connectdata *conn;
  pingpong *pp_local;
  
  pcVar1 = pp->conn;
  pCVar2 = pcVar1->data;
  if ((pCVar2->set).server_response_timeout == 0) {
    local_60 = pp->response_time;
  }
  else {
    local_60 = (pCVar2->set).server_response_timeout;
  }
  tVar4 = curlx_tvnow();
  tVar3 = curlx_tvdiff(tVar4,pp->response);
  timeout2_ms = local_60 - tVar3;
  if ((pCVar2->set).timeout != 0) {
    local_78 = (pCVar2->set).timeout;
    tVar4 = curlx_tvnow();
    tVar3 = curlx_tvdiff(tVar4,pcVar1->now);
    local_78 = local_78 - tVar3;
    if (timeout2_ms < local_78) {
      local_78 = timeout2_ms;
    }
    timeout2_ms = local_78;
  }
  return timeout2_ms;
}

Assistant:

time_t Curl_pp_state_timeout(struct pingpong *pp)
{
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data=conn->data;
  time_t timeout_ms; /* in milliseconds */
  time_t timeout2_ms; /* in milliseconds */
  long response_time= (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_tvdiff(Curl_tvnow(), pp->response); /* spent time */

  if(data->set.timeout) {
    /* if timeout is requested, find out how much remaining time we have */
    timeout2_ms = data->set.timeout - /* timeout time */
      Curl_tvdiff(Curl_tvnow(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}